

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SentencePieceLearner.cc
# Opt level: O2

void __thiscall
onmt::SentencePieceLearner::learn
          (SentencePieceLearner *this,string *model_path,char *param_2,bool verbose)

{
  basic_ofstream<char,_std::char_traits<char>_> *pbVar1;
  runtime_error *this_00;
  byte bVar2;
  string_view args;
  Status status;
  string sp_model_path;
  string sp_vocab_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  bVar2 = verbose | (this->super_SubwordLearner)._verbose;
  if ((this->_input_stream)._M_t.
      super___uniq_ptr_impl<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
      .super__Head_base<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_false>.
      _M_head_impl != (basic_ofstream<char,_std::char_traits<char>_> *)0x0) {
    std::ostream::flush();
    pbVar1 = (this->_input_stream)._M_t.
             super___uniq_ptr_impl<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
             .super__Head_base<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_false>.
             _M_head_impl;
    (this->_input_stream)._M_t.
    super___uniq_ptr_impl<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
    .super__Head_base<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_false>._M_head_impl
         = (basic_ofstream<char,_std::char_traits<char>_> *)0x0;
    if (pbVar1 != (basic_ofstream<char,_std::char_traits<char>_> *)0x0) {
      (**(code **)(*(long *)pbVar1 + 8))();
    }
  }
  if ((bVar2 & 1) == 0) {
    std::ios::setstate((int)*(undefined8 *)(std::cerr + -0x18) + 0x3c2790);
  }
  std::operator+(&local_48,&this->_args," --input=");
  std::operator+(&local_68,&local_48,&this->_input_filename);
  std::operator+(&sp_vocab_path,&local_68," --model_prefix=");
  std::operator+(&sp_model_path,&sp_vocab_path,model_path);
  args._M_str = (char *)sp_model_path._M_string_length;
  args._M_len = (size_t)&status;
  sentencepiece::SentencePieceTrainer::Train
            (args,(SentenceIterator *)sp_model_path._M_dataplus._M_p,(string *)0x0);
  std::__cxx11::string::~string((string *)&sp_model_path);
  std::__cxx11::string::~string((string *)&sp_vocab_path);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  if ((bVar2 & 1) == 0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x3c2790);
  }
  if (this->_keep_input_file == false) {
    remove((this->_input_filename)._M_dataplus._M_p);
  }
  std::operator+(&sp_model_path,model_path,".model");
  std::operator+(&sp_vocab_path,model_path,".vocab");
  if (status.rep_._M_t.
      super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
      ._M_t.
      super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
      .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl ==
      (__uniq_ptr_data<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>,_true,_true>
       )0x0) {
    if (this->_keep_vocab == false) {
      rename(sp_model_path._M_dataplus._M_p,(model_path->_M_dataplus)._M_p);
      remove(sp_vocab_path._M_dataplus._M_p);
    }
    std::__cxx11::string::~string((string *)&sp_vocab_path);
    std::__cxx11::string::~string((string *)&sp_model_path);
    sentencepiece::util::Status::~Status(&status);
    return;
  }
  remove(sp_model_path._M_dataplus._M_p);
  remove(sp_vocab_path._M_dataplus._M_p);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  sentencepiece::util::Status::ToString_abi_cxx11_(&local_48,&status);
  std::operator+(&local_68,"SentencePieceTrainer: ",&local_48);
  std::runtime_error::runtime_error(this_00,(string *)&local_68);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void SentencePieceLearner::learn(const std::string& model_path, const char*, bool verbose)
  {
    verbose = verbose || _verbose;
    if (_input_stream) {
      _input_stream->flush();
      _input_stream.reset();  // Freeze the input file for training.
    }

    if (!verbose)
      std::cerr.setstate(std::ios_base::failbit);
    auto status = sentencepiece::SentencePieceTrainer::Train(_args
                                                             + " --input=" + _input_filename
                                                             + " --model_prefix=" + model_path);
    if (!verbose)
      std::cerr.clear();

    // Cleanup the input file.
    if (!_keep_input_file) { remove(_input_filename.c_str()); }

    std::string sp_model_path = model_path + ".model";
    std::string sp_vocab_path = model_path + ".vocab";

    if (!status.ok())
    {
      // Cleanup the output files on error.
      remove(sp_model_path.c_str());
      remove(sp_vocab_path.c_str());
      throw std::runtime_error("SentencePieceTrainer: " + status.ToString());
    }
    else if (!_keep_vocab)
    {
      // Remove the generated vocabulary and move the model to the request path.
      rename(sp_model_path.c_str(), model_path.c_str());
      remove(sp_vocab_path.c_str());
    }
  }